

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_location)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined8 uVar7;
  char *pcVar8;
  REF_STATUS RVar9;
  REF_INT tri;
  double dVar10;
  double dVar11;
  REF_DBL quality;
  ulong local_d8;
  double local_d0;
  REF_DBL tri_ideal [3];
  REF_INT nodes [27];
  
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    ideal_location[lVar5] = 0.0;
  }
  uVar6 = 0xffffffff;
  tri = -1;
  if (-1 < node) {
    pRVar1 = ref_grid->cell[3]->ref_adj;
    uVar6 = 0xffffffff;
    tri = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar6 = 0xffffffff;
      tri = -1;
      if ((long)(int)uVar4 != -1) {
        tri = pRVar1->item[(int)uVar4].ref;
        uVar6 = (ulong)uVar4;
      }
    }
  }
  dVar11 = 0.0;
  while( true ) {
    if ((int)uVar6 == -1) {
      dVar10 = dVar11 * 1e+20;
      if (dVar10 <= -dVar10) {
        dVar10 = -dVar10;
      }
      if (dVar10 <= 1.0) {
        pRVar3 = ref_grid->node->real;
        lVar5 = (long)(node * 0xf);
        printf("normalization = %e at %e %e %e\n",dVar11,pRVar3[lVar5],pRVar3[lVar5 + 1],
               pRVar3[lVar5 + 2]);
        RVar9 = 4;
      }
      else {
        RVar9 = 0;
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          ideal_location[lVar5] = ideal_location[lVar5] * (1.0 / dVar11);
        }
      }
      return RVar9;
    }
    local_d8 = uVar6;
    local_d0 = dVar11;
    uVar4 = ref_smooth_tri_ideal(ref_grid,node,tri,tri_ideal);
    if (uVar4 != 0) break;
    uVar4 = ref_cell_nodes(ref_grid->cell[3],tri,nodes);
    if (uVar4 != 0) {
      uVar6 = (ulong)uVar4;
      pcVar8 = "nodes";
      uVar7 = 0x223;
      goto LAB_001d49d5;
    }
    uVar4 = ref_node_tri_quality(ref_grid->node,nodes,&quality);
    if (uVar4 != 0) {
      uVar6 = (ulong)uVar4;
      pcVar8 = "tri qual";
      uVar7 = 0x225;
      goto LAB_001d49d5;
    }
    dVar11 = ref_grid->adapt->smooth_min_quality;
    if (quality <= dVar11) {
      quality = dVar11;
    }
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      ideal_location[lVar5] = tri_ideal[lVar5] * (1.0 / quality) + ideal_location[lVar5];
    }
    dVar11 = local_d0 + 1.0 / quality;
    pRVar2 = ref_grid->cell[3]->ref_adj->item;
    uVar6 = (ulong)pRVar2[(int)local_d8].next;
    tri = -1;
    if (uVar6 != 0xffffffffffffffff) {
      tri = pRVar2[uVar6].ref;
    }
  }
  uVar6 = (ulong)uVar4;
  pcVar8 = "tri ideal";
  uVar7 = 0x222;
LAB_001d49d5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar7,
         "ref_smooth_tri_weighted_ideal",uVar6,pcVar8);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_weighted_ideal(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *ideal_location) {
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ixyz;
  REF_DBL tri_ideal[3];
  REF_DBL quality, weight, normalization;

  normalization = 0.0;
  for (ixyz = 0; ixyz < 3; ixyz++) ideal_location[ixyz] = 0.0;

  each_ref_cell_having_node(ref_grid_tri(ref_grid), node, item, cell) {
    RSS(ref_smooth_tri_ideal(ref_grid, node, cell, tri_ideal), "tri ideal");
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell, nodes), "nodes");
    RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
        "tri qual");
    quality = MAX(quality, ref_grid_adapt(ref_grid, smooth_min_quality));
    weight = 1.0 / quality;
    normalization += weight;
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] += weight * tri_ideal[ixyz];
  }

  if (ref_math_divisible(1.0, normalization)) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ideal_location[ixyz] = (1.0 / normalization) * ideal_location[ixyz];
  } else {
    printf("normalization = %e at %e %e %e\n", normalization,
           ref_node_xyz(ref_grid_node(ref_grid), 0, node),
           ref_node_xyz(ref_grid_node(ref_grid), 1, node),
           ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}